

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

char * __thiscall ASDCP::UL::EncodeString(UL *this,char *str_buf,ui32_t buf_len)

{
  ui32_t buf_len_local;
  char *str_buf_local;
  UL *this_local;
  
  this_local = (UL *)str_buf;
  if (buf_len < 0x27) {
    if (buf_len < 0x21) {
      this_local = (UL *)0x0;
    }
    else {
      snprintf(str_buf,(ulong)buf_len,
               "%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
               (ulong)(this->super_Identifier<16U>).m_Value[0],
               (ulong)(this->super_Identifier<16U>).m_Value[1],
               (ulong)(this->super_Identifier<16U>).m_Value[2],
               (uint)(this->super_Identifier<16U>).m_Value[3],
               (uint)(this->super_Identifier<16U>).m_Value[4],
               (uint)(this->super_Identifier<16U>).m_Value[5],
               (uint)(this->super_Identifier<16U>).m_Value[6],
               (uint)(this->super_Identifier<16U>).m_Value[7],
               (uint)(this->super_Identifier<16U>).m_Value[8],
               (uint)(this->super_Identifier<16U>).m_Value[9],
               (uint)(this->super_Identifier<16U>).m_Value[10],
               (uint)(this->super_Identifier<16U>).m_Value[0xb],
               (uint)(this->super_Identifier<16U>).m_Value[0xc],
               (uint)(this->super_Identifier<16U>).m_Value[0xd],
               (uint)(this->super_Identifier<16U>).m_Value[0xe],
               (uint)(this->super_Identifier<16U>).m_Value[0xf]);
    }
  }
  else {
    snprintf(str_buf,(ulong)buf_len,
             "%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x",
             (ulong)(this->super_Identifier<16U>).m_Value[0],
             (ulong)(this->super_Identifier<16U>).m_Value[1],
             (ulong)(this->super_Identifier<16U>).m_Value[2],
             (uint)(this->super_Identifier<16U>).m_Value[3],
             (uint)(this->super_Identifier<16U>).m_Value[4],
             (uint)(this->super_Identifier<16U>).m_Value[5],
             (uint)(this->super_Identifier<16U>).m_Value[6],
             (uint)(this->super_Identifier<16U>).m_Value[7],
             (uint)(this->super_Identifier<16U>).m_Value[8],
             (uint)(this->super_Identifier<16U>).m_Value[9],
             (uint)(this->super_Identifier<16U>).m_Value[10],
             (uint)(this->super_Identifier<16U>).m_Value[0xb],
             (uint)(this->super_Identifier<16U>).m_Value[0xc],
             (uint)(this->super_Identifier<16U>).m_Value[0xd],
             (uint)(this->super_Identifier<16U>).m_Value[0xe],
             (uint)(this->super_Identifier<16U>).m_Value[0xf]);
  }
  return (char *)this_local;
}

Assistant:

const char*
ASDCP::UL::EncodeString(char* str_buf, ui32_t buf_len) const
{
  if ( buf_len > 38 ) // room for dotted notation?
    {
      snprintf(str_buf, buf_len,
	       "%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x.%02x%02x%02x%02x",
	       m_Value[0],  m_Value[1],  m_Value[2],  m_Value[3],
	       m_Value[4],  m_Value[5],  m_Value[6],  m_Value[7],
	       m_Value[8],  m_Value[9],  m_Value[10], m_Value[11],
	       m_Value[12], m_Value[13], m_Value[14], m_Value[15]
               );

      return str_buf;
    }
  else if ( buf_len > 32 ) // room for compact?
    {
      snprintf(str_buf, buf_len,
	       "%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x",
	       m_Value[0],  m_Value[1],  m_Value[2],  m_Value[3],
	       m_Value[4],  m_Value[5],  m_Value[6],  m_Value[7],
	       m_Value[8],  m_Value[9],  m_Value[10], m_Value[11],
	       m_Value[12], m_Value[13], m_Value[14], m_Value[15]
               );

      return str_buf;
    }

  return 0;
}